

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  
  *(undefined8 *)this = 0x8bad00;
  *(undefined8 *)&this->field_0xc8 = 0x8bada0;
  *(undefined8 *)&this->field_0x10 = 0x8bad28;
  *(undefined8 *)&this->field_0x70 = 0x8bad50;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x8bad78;
  puVar1 = *(undefined1 **)
            &(this->
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
             field_0x20;
  if (puVar1 != &this->field_0xb0) {
    operator_delete(puVar1,*(long *)&this->field_0xb0 + 1);
  }
  *(undefined8 *)this = 0x8baf18;
  *(undefined8 *)&this->field_0xc8 = 0x8baf68;
  *(undefined8 *)&this->field_0x10 = 0x8baf40;
  if (*(undefined1 **)&this->field_0x48 != &this->field_0x58) {
    operator_delete(*(undefined1 **)&this->field_0x48,*(long *)&this->field_0x58 + 1);
  }
  pvVar2 = *(void **)&this->field_0x30;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this->field_0x40 - (long)pvVar2);
  }
  operator_delete(this,0xe0);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}